

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeDataDrop(TranslateToFuzzReader *this)

{
  Index IVar1;
  size_type sVar2;
  reference this_00;
  pointer pDVar3;
  Name segment;
  Type TStack_20;
  Index segIdx;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  
  local_18 = this;
  if ((this->allowMemory & 1U) == 0) {
    Type::Type(&stack0xffffffffffffffe0,none);
    this_local = (TranslateToFuzzReader *)makeTrivial(this,TStack_20);
  }
  else {
    sVar2 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::size(&this->wasm->dataSegments);
    IVar1 = upTo(this,(Index)sVar2);
    this_00 = std::
              vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ::operator[](&this->wasm->dataSegments,(ulong)IVar1);
    pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (this_00);
    this_local = (TranslateToFuzzReader *)
                 Builder::makeDataDrop
                           (&this->builder,(Name)(pDVar3->super_Named).name.super_IString.str);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TranslateToFuzzReader::makeDataDrop() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  return builder.makeDataDrop(segment);
}